

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

group * clipp::operator&(group *__return_storage_ptr__,parameter *a,parameter *b)

{
  group *pgVar1;
  parameter local_268;
  parameter local_168;
  group local_68;
  parameter *local_20;
  parameter *b_local;
  parameter *a_local;
  
  local_20 = b;
  b_local = a;
  a_local = (parameter *)__return_storage_ptr__;
  detail::token<clipp::parameter>::blocking(&a->super_token<clipp::parameter>,true);
  detail::token<clipp::parameter>::blocking(&b->super_token<clipp::parameter>,true);
  parameter::parameter(&local_168,a);
  parameter::parameter(&local_268,b);
  group::group<clipp::parameter>(&local_68,&local_168,&local_268);
  pgVar1 = group::scoped(&local_68,true);
  group::group(__return_storage_ptr__,pgVar1);
  group::~group(&local_68);
  parameter::~parameter(&local_268);
  parameter::~parameter(&local_168);
  return __return_storage_ptr__;
}

Assistant:

inline group
operator & (parameter a, parameter b)
{
    a.blocking(true);
    b.blocking(true);
    return group{std::move(a), std::move(b)}.scoped(true);
}